

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# disci_intersector.h
# Opt level: O2

void embree::avx::OrientedDiscMiIntersectorK<8,_4,_true>::intersect
               (Precalculations *pre,RayHitK<4> *ray,size_t k,RayQueryContext *context,
               Primitive *Disc)

{
  float fVar1;
  float fVar2;
  float fVar3;
  float fVar4;
  float fVar5;
  float fVar6;
  undefined4 uVar7;
  undefined4 uVar8;
  undefined1 auVar9 [16];
  Scene *pSVar10;
  Geometry *pGVar11;
  long lVar12;
  __int_type_conflict _Var13;
  RTCFilterFunctionN p_Var14;
  float fVar15;
  float fVar16;
  float fVar17;
  float fVar18;
  float fVar19;
  float fVar20;
  float fVar21;
  undefined1 auVar22 [32];
  uint uVar23;
  uint uVar24;
  ulong uVar25;
  ulong uVar26;
  undefined1 (*pauVar27) [16];
  ulong uVar28;
  ulong uVar29;
  ulong uVar30;
  ulong uVar31;
  ulong uVar32;
  ulong uVar33;
  undefined1 auVar34 [32];
  undefined1 auVar35 [32];
  undefined1 auVar36 [32];
  undefined1 auVar37 [32];
  undefined1 auVar38 [32];
  undefined1 auVar39 [32];
  undefined1 auVar40 [32];
  undefined1 auVar41 [32];
  undefined1 auVar42 [32];
  undefined1 auVar43 [32];
  undefined1 auVar44 [32];
  undefined1 auVar45 [64];
  undefined1 auVar46 [32];
  undefined1 auVar47 [32];
  undefined1 auVar48 [32];
  undefined1 auVar50 [32];
  undefined1 auVar51 [32];
  undefined1 auVar52 [64];
  undefined1 auVar53 [32];
  undefined1 auVar54 [64];
  undefined1 auVar55 [16];
  undefined1 auVar56 [16];
  undefined1 auVar57 [32];
  undefined1 auVar58 [64];
  undefined1 auVar59 [32];
  undefined1 auVar60 [32];
  undefined1 auVar61 [64];
  undefined1 auVar62 [32];
  float in_register_0000159c;
  undefined1 auVar63 [32];
  undefined1 auVar64 [32];
  RTCFilterFunctionNArguments args;
  vbool<8> valid;
  undefined1 local_300 [16];
  RTCFilterFunctionNArguments local_2f0;
  undefined1 local_2c0 [32];
  undefined1 local_2a0 [32];
  undefined1 local_280 [32];
  RTCHitN local_250 [16];
  undefined1 local_240 [16];
  undefined1 local_230 [16];
  undefined4 local_220;
  undefined4 uStack_21c;
  undefined4 uStack_218;
  undefined4 uStack_214;
  undefined4 local_210;
  undefined4 uStack_20c;
  undefined4 uStack_208;
  undefined4 uStack_204;
  uint local_200;
  uint uStack_1fc;
  uint uStack_1f8;
  uint uStack_1f4;
  undefined1 local_1f0 [16];
  uint local_1e0;
  uint uStack_1dc;
  uint uStack_1d8;
  uint uStack_1d4;
  uint uStack_1d0;
  uint uStack_1cc;
  uint uStack_1c8;
  uint uStack_1c4;
  undefined1 local_1c0 [32];
  undefined1 local_1a0 [32];
  undefined1 local_180 [16];
  undefined1 local_170 [16];
  undefined1 local_160 [32];
  undefined1 local_140 [32];
  undefined1 local_120 [32];
  undefined8 local_100;
  undefined8 uStack_f8;
  undefined8 uStack_f0;
  undefined8 uStack_e8;
  undefined1 local_e0 [32];
  undefined8 local_c0;
  undefined8 uStack_b8;
  undefined8 uStack_b0;
  undefined8 uStack_a8;
  undefined1 local_a0 [32];
  undefined1 local_80 [32];
  undefined1 auVar49 [64];
  
  pSVar10 = context->scene;
  uVar24 = Disc->sharedGeomID;
  uVar26 = (ulong)(Disc->primIDs).field_0.i[0];
  pGVar11 = (pSVar10->geometries).items[uVar24].ptr;
  lVar12 = *(long *)&pGVar11->field_0x58;
  _Var13 = pGVar11[1].super_RefCount.refCounter.super___atomic_base<unsigned_long>._M_i;
  uVar30 = (ulong)(Disc->primIDs).field_0.i[1];
  uVar29 = (ulong)(Disc->primIDs).field_0.i[4];
  auVar34._16_16_ = *(undefined1 (*) [16])(lVar12 + _Var13 * uVar29);
  auVar34._0_16_ = *(undefined1 (*) [16])(lVar12 + _Var13 * uVar26);
  uVar31 = (ulong)(Disc->primIDs).field_0.i[5];
  auVar36._16_16_ = *(undefined1 (*) [16])(lVar12 + _Var13 * uVar31);
  auVar36._0_16_ = *(undefined1 (*) [16])(lVar12 + _Var13 * uVar30);
  uVar33 = (ulong)(Disc->primIDs).field_0.i[2];
  uVar32 = (ulong)(Disc->primIDs).field_0.i[3];
  uVar28 = (ulong)(Disc->primIDs).field_0.i[6];
  auVar37._16_16_ = *(undefined1 (*) [16])(lVar12 + _Var13 * uVar28);
  auVar37._0_16_ = *(undefined1 (*) [16])(lVar12 + _Var13 * uVar33);
  uVar25 = (ulong)(Disc->primIDs).field_0.i[7];
  auVar38._16_16_ = *(undefined1 (*) [16])(lVar12 + _Var13 * uVar25);
  auVar38._0_16_ = *(undefined1 (*) [16])(lVar12 + _Var13 * uVar32);
  lVar12 = *(long *)&pGVar11[1].time_range.upper;
  p_Var14 = pGVar11[1].intersectionFilterN;
  auVar46._16_16_ = *(undefined1 (*) [16])(lVar12 + uVar29 * (long)p_Var14);
  auVar46._0_16_ = *(undefined1 (*) [16])(lVar12 + uVar26 * (long)p_Var14);
  auVar50._16_16_ = *(undefined1 (*) [16])(lVar12 + uVar31 * (long)p_Var14);
  auVar50._0_16_ = *(undefined1 (*) [16])(lVar12 + uVar30 * (long)p_Var14);
  auVar53._16_16_ = *(undefined1 (*) [16])(lVar12 + uVar28 * (long)p_Var14);
  auVar53._0_16_ = *(undefined1 (*) [16])(lVar12 + uVar33 * (long)p_Var14);
  auVar57._16_16_ = *(undefined1 (*) [16])(lVar12 + (long)p_Var14 * uVar25);
  auVar57._0_16_ = *(undefined1 (*) [16])(lVar12 + uVar32 * (long)p_Var14);
  auVar40 = vunpcklps_avx(auVar34,auVar37);
  local_280 = vunpckhps_avx(auVar34,auVar37);
  auVar34 = vunpcklps_avx(auVar36,auVar38);
  auVar22 = vunpckhps_avx(auVar36,auVar38);
  auVar48 = vunpcklps_avx(auVar40,auVar34);
  auVar42 = vunpckhps_avx(auVar40,auVar34);
  local_2c0 = vunpcklps_avx(local_280,auVar22);
  auVar36 = vunpcklps_avx(auVar46,auVar53);
  auVar40 = vunpckhps_avx(auVar46,auVar53);
  auVar37 = vunpcklps_avx(auVar50,auVar57);
  auVar34 = vunpckhps_avx(auVar50,auVar57);
  local_80 = vunpcklps_avx(auVar40,auVar34);
  local_a0 = vunpcklps_avx(auVar36,auVar37);
  local_e0 = vunpckhps_avx(auVar36,auVar37);
  local_170 = vshufps_avx(ZEXT416(uVar24),ZEXT416(uVar24),0);
  local_180 = local_170;
  fVar1 = *(float *)(ray + k * 4 + 0x10);
  auVar47._4_4_ = fVar1;
  auVar47._0_4_ = fVar1;
  auVar47._8_4_ = fVar1;
  auVar47._12_4_ = fVar1;
  auVar47._16_4_ = fVar1;
  auVar47._20_4_ = fVar1;
  auVar47._24_4_ = fVar1;
  auVar47._28_4_ = fVar1;
  fVar2 = *(float *)(ray + k * 4 + 0x40);
  auVar51._4_4_ = fVar2;
  auVar51._0_4_ = fVar2;
  auVar51._8_4_ = fVar2;
  auVar51._12_4_ = fVar2;
  auVar51._16_4_ = fVar2;
  auVar51._20_4_ = fVar2;
  auVar51._24_4_ = fVar2;
  auVar51._28_4_ = fVar2;
  fVar3 = *(float *)(ray + k * 4 + 0x50);
  fVar4 = *(float *)(ray + k * 4 + 0x60);
  auVar55._4_4_ = fVar4;
  auVar55._0_4_ = fVar4;
  auVar55._8_4_ = fVar4;
  auVar55._12_4_ = fVar4;
  auVar59._0_4_ = fVar2 * local_a0._0_4_ + fVar3 * local_e0._0_4_ + fVar4 * local_80._0_4_;
  auVar59._4_4_ = fVar2 * local_a0._4_4_ + fVar3 * local_e0._4_4_ + fVar4 * local_80._4_4_;
  auVar59._8_4_ = fVar2 * local_a0._8_4_ + fVar3 * local_e0._8_4_ + fVar4 * local_80._8_4_;
  auVar59._12_4_ = fVar2 * local_a0._12_4_ + fVar3 * local_e0._12_4_ + fVar4 * local_80._12_4_;
  auVar59._16_4_ = fVar2 * local_a0._16_4_ + fVar3 * local_e0._16_4_ + fVar4 * local_80._16_4_;
  auVar59._20_4_ = fVar2 * local_a0._20_4_ + fVar3 * local_e0._20_4_ + fVar4 * local_80._20_4_;
  auVar59._24_4_ = fVar2 * local_a0._24_4_ + fVar3 * local_e0._24_4_ + fVar4 * local_80._24_4_;
  auVar59._28_4_ = in_register_0000159c + in_register_0000159c + 0.0;
  auVar34 = vcmpps_avx(auVar59,ZEXT432(0) << 0x20,0);
  auVar56 = vpshufd_avx(ZEXT116(Disc->numPrimitives),0);
  auVar62._16_16_ = auVar56;
  auVar62._0_16_ = auVar56;
  auVar40 = vcvtdq2ps_avx(auVar62);
  auVar36 = vcmpps_avx(_DAT_01f7b060,auVar40,1);
  auVar64._8_4_ = 0x3f800000;
  auVar64._0_8_ = 0x3f8000003f800000;
  auVar64._12_4_ = 0x3f800000;
  auVar64._16_4_ = 0x3f800000;
  auVar64._20_4_ = 0x3f800000;
  auVar64._24_4_ = 0x3f800000;
  auVar64._28_4_ = 0x3f800000;
  auVar40 = vblendvps_avx(auVar59,auVar64,auVar34);
  fVar5 = *(float *)(ray + k * 4 + 0x20);
  auVar60._4_4_ = fVar5;
  auVar60._0_4_ = fVar5;
  auVar60._8_4_ = fVar5;
  auVar60._12_4_ = fVar5;
  auVar60._16_4_ = fVar5;
  auVar60._20_4_ = fVar5;
  auVar60._24_4_ = fVar5;
  auVar60._28_4_ = fVar5;
  auVar34 = vandnps_avx(auVar34,auVar36);
  auVar36 = vsubps_avx(local_2c0,auVar60);
  auVar50 = local_80;
  auVar37 = vsubps_avx(auVar42,auVar47);
  fVar6 = *(float *)(ray + k * 4);
  auVar63._4_4_ = fVar6;
  auVar63._0_4_ = fVar6;
  auVar63._8_4_ = fVar6;
  auVar63._12_4_ = fVar6;
  auVar63._16_4_ = fVar6;
  auVar63._20_4_ = fVar6;
  auVar63._24_4_ = fVar6;
  auVar63._28_4_ = fVar6;
  auVar38 = vsubps_avx(auVar48,auVar63);
  auVar46 = local_a0;
  auVar39._0_4_ =
       local_a0._0_4_ * auVar38._0_4_ +
       auVar36._0_4_ * local_80._0_4_ + local_e0._0_4_ * auVar37._0_4_;
  auVar39._4_4_ =
       local_a0._4_4_ * auVar38._4_4_ +
       auVar36._4_4_ * local_80._4_4_ + local_e0._4_4_ * auVar37._4_4_;
  auVar39._8_4_ =
       local_a0._8_4_ * auVar38._8_4_ +
       auVar36._8_4_ * local_80._8_4_ + local_e0._8_4_ * auVar37._8_4_;
  auVar39._12_4_ =
       local_a0._12_4_ * auVar38._12_4_ +
       auVar36._12_4_ * local_80._12_4_ + local_e0._12_4_ * auVar37._12_4_;
  auVar39._16_4_ =
       local_a0._16_4_ * auVar38._16_4_ +
       auVar36._16_4_ * local_80._16_4_ + local_e0._16_4_ * auVar37._16_4_;
  auVar39._20_4_ =
       local_a0._20_4_ * auVar38._20_4_ +
       auVar36._20_4_ * local_80._20_4_ + local_e0._20_4_ * auVar37._20_4_;
  auVar39._24_4_ =
       local_a0._24_4_ * auVar38._24_4_ +
       auVar36._24_4_ * local_80._24_4_ + local_e0._24_4_ * auVar37._24_4_;
  auVar39._28_4_ = auVar38._28_4_ + auVar36._28_4_ + auVar37._28_4_;
  local_120 = vdivps_avx(auVar39,auVar40);
  auVar45 = ZEXT3264(local_120);
  uVar7 = *(undefined4 *)(ray + k * 4 + 0x30);
  auVar40._4_4_ = uVar7;
  auVar40._0_4_ = uVar7;
  auVar40._8_4_ = uVar7;
  auVar40._12_4_ = uVar7;
  auVar40._16_4_ = uVar7;
  auVar40._20_4_ = uVar7;
  auVar40._24_4_ = uVar7;
  auVar40._28_4_ = uVar7;
  uVar7 = *(undefined4 *)(ray + k * 4 + 0x80);
  local_1a0._4_4_ = uVar7;
  local_1a0._0_4_ = uVar7;
  local_1a0._8_4_ = uVar7;
  local_1a0._12_4_ = uVar7;
  local_1a0._16_4_ = uVar7;
  local_1a0._20_4_ = uVar7;
  local_1a0._24_4_ = uVar7;
  local_1a0._28_4_ = uVar7;
  auVar40 = vcmpps_avx(auVar40,local_120,2);
  auVar36 = vcmpps_avx(local_120,local_1a0,2);
  auVar40 = vandps_avx(auVar40,auVar36);
  auVar37 = auVar34 & auVar40;
  if ((((((((auVar37 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
           (auVar37 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
          (auVar37 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
         SUB321(auVar37 >> 0x7f,0) != '\0') ||
        (auVar37 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
       SUB321(auVar37 >> 0xbf,0) != '\0') ||
      (auVar37 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) || auVar37[0x1f] < '\0') {
    auVar40 = vandps_avx(auVar40,auVar34);
    auVar38 = vunpckhps_avx(local_280,auVar22);
    fVar15 = local_120._0_4_;
    fVar16 = local_120._4_4_;
    fVar17 = local_120._8_4_;
    fVar18 = local_120._12_4_;
    fVar19 = local_120._16_4_;
    fVar20 = local_120._20_4_;
    fVar21 = local_120._24_4_;
    auVar41._0_4_ = fVar6 + fVar2 * fVar15;
    auVar41._4_4_ = fVar6 + fVar2 * fVar16;
    auVar41._8_4_ = fVar6 + fVar2 * fVar17;
    auVar41._12_4_ = fVar6 + fVar2 * fVar18;
    auVar41._16_4_ = fVar6 + fVar2 * fVar19;
    auVar41._20_4_ = fVar6 + fVar2 * fVar20;
    auVar41._24_4_ = fVar6 + fVar2 * fVar21;
    auVar41._28_4_ = fVar6 + auVar36._28_4_;
    auVar44._0_4_ = fVar1 + fVar3 * fVar15;
    auVar44._4_4_ = fVar1 + fVar3 * fVar16;
    auVar44._8_4_ = fVar1 + fVar3 * fVar17;
    auVar44._12_4_ = fVar1 + fVar3 * fVar18;
    auVar44._16_4_ = fVar1 + fVar3 * fVar19;
    auVar44._20_4_ = fVar1 + fVar3 * fVar20;
    auVar44._24_4_ = fVar1 + fVar3 * fVar21;
    auVar44._28_4_ = fVar1 + local_a0._28_4_;
    auVar43._0_4_ = fVar5 + fVar4 * fVar15;
    auVar43._4_4_ = fVar5 + fVar4 * fVar16;
    auVar43._8_4_ = fVar5 + fVar4 * fVar17;
    auVar43._12_4_ = fVar5 + fVar4 * fVar18;
    auVar43._16_4_ = fVar5 + fVar4 * fVar19;
    auVar43._20_4_ = fVar5 + fVar4 * fVar20;
    auVar43._24_4_ = fVar5 + fVar4 * fVar21;
    auVar43._28_4_ = fVar5 + auVar22._28_4_;
    auVar34 = vsubps_avx(auVar41,auVar48);
    auVar36 = vsubps_avx(auVar44,auVar42);
    auVar37 = vsubps_avx(auVar43,local_2c0);
    auVar42._0_4_ =
         auVar34._0_4_ * auVar34._0_4_ +
         auVar36._0_4_ * auVar36._0_4_ + auVar37._0_4_ * auVar37._0_4_;
    auVar42._4_4_ =
         auVar34._4_4_ * auVar34._4_4_ +
         auVar36._4_4_ * auVar36._4_4_ + auVar37._4_4_ * auVar37._4_4_;
    auVar42._8_4_ =
         auVar34._8_4_ * auVar34._8_4_ +
         auVar36._8_4_ * auVar36._8_4_ + auVar37._8_4_ * auVar37._8_4_;
    auVar42._12_4_ =
         auVar34._12_4_ * auVar34._12_4_ +
         auVar36._12_4_ * auVar36._12_4_ + auVar37._12_4_ * auVar37._12_4_;
    auVar42._16_4_ =
         auVar34._16_4_ * auVar34._16_4_ +
         auVar36._16_4_ * auVar36._16_4_ + auVar37._16_4_ * auVar37._16_4_;
    auVar42._20_4_ =
         auVar34._20_4_ * auVar34._20_4_ +
         auVar36._20_4_ * auVar36._20_4_ + auVar37._20_4_ * auVar37._20_4_;
    auVar42._24_4_ =
         auVar34._24_4_ * auVar34._24_4_ +
         auVar36._24_4_ * auVar36._24_4_ + auVar37._24_4_ * auVar37._24_4_;
    auVar42._28_4_ = auVar34._28_4_ + auVar36._28_4_ + auVar37._28_4_;
    auVar22._4_4_ = auVar38._4_4_ * auVar38._4_4_;
    auVar22._0_4_ = auVar38._0_4_ * auVar38._0_4_;
    auVar22._8_4_ = auVar38._8_4_ * auVar38._8_4_;
    auVar22._12_4_ = auVar38._12_4_ * auVar38._12_4_;
    auVar22._16_4_ = auVar38._16_4_ * auVar38._16_4_;
    auVar22._20_4_ = auVar38._20_4_ * auVar38._20_4_;
    auVar22._24_4_ = auVar38._24_4_ * auVar38._24_4_;
    auVar22._28_4_ = auVar38._28_4_;
    auVar34 = vcmpps_avx(auVar42,auVar22,1);
    auVar36 = auVar40 & auVar34;
    if ((((((((auVar36 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
             (auVar36 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
            (auVar36 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
           SUB321(auVar36 >> 0x7f,0) != '\0') ||
          (auVar36 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
         SUB321(auVar36 >> 0xbf,0) != '\0') ||
        (auVar36 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) || auVar36[0x1f] < '\0')
    {
      local_2a0 = vandps_avx(auVar40,auVar34);
      local_140 = ZEXT1232(ZEXT412(0)) << 0x20;
      local_160 = ZEXT1232(ZEXT412(0)) << 0x20;
      local_100 = local_a0._0_8_;
      uStack_f8 = local_a0._8_8_;
      uStack_f0 = local_a0._16_8_;
      uStack_e8 = local_a0._24_8_;
      local_c0 = local_80._0_8_;
      uStack_b8 = local_80._8_8_;
      uStack_b0 = local_80._16_8_;
      uStack_a8 = local_80._24_8_;
      auVar48._8_4_ = 0x7f800000;
      auVar48._0_8_ = 0x7f8000007f800000;
      auVar48._12_4_ = 0x7f800000;
      auVar48._16_4_ = 0x7f800000;
      auVar48._20_4_ = 0x7f800000;
      auVar48._24_4_ = 0x7f800000;
      auVar48._28_4_ = 0x7f800000;
      auVar49 = ZEXT3264(auVar48);
      auVar40 = vblendvps_avx(auVar48,local_120,local_2a0);
      auVar34 = vshufps_avx(auVar40,auVar40,0xb1);
      auVar34 = vminps_avx(auVar40,auVar34);
      auVar36 = vshufpd_avx(auVar34,auVar34,5);
      auVar34 = vminps_avx(auVar34,auVar36);
      auVar36 = vperm2f128_avx(auVar34,auVar34,1);
      auVar34 = vminps_avx(auVar34,auVar36);
      auVar34 = vcmpps_avx(auVar40,auVar34,0);
      auVar36 = local_2a0 & auVar34;
      auVar40 = local_2a0;
      if ((((((((auVar36 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
               (auVar36 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
              (auVar36 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
             SUB321(auVar36 >> 0x7f,0) != '\0') ||
            (auVar36 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
           SUB321(auVar36 >> 0xbf,0) != '\0') ||
          (auVar36 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
          auVar36[0x1f] < '\0') {
        auVar40 = vandps_avx(auVar34,local_2a0);
      }
      uVar23 = vmovmskps_avx(auVar40);
      uVar24 = 0;
      if (uVar23 != 0) {
        for (; (uVar23 >> uVar24 & 1) == 0; uVar24 = uVar24 + 1) {
        }
      }
      pauVar27 = (undefined1 (*) [16])(mm_lookupmask_ps + (long)(1 << ((byte)k & 0x1f)) * 0x10);
      auVar40 = vcmpps_avx(auVar51,auVar51,0xf);
      auVar52 = ZEXT3264(auVar40);
      auVar54 = ZEXT464(0) << 0x20;
      auVar56 = vpcmpeqd_avx(auVar55,auVar55);
      auVar58 = ZEXT1664(auVar56);
      auVar61 = ZEXT1664(CONCAT88(0x100000001,0x100000001));
      local_a0 = auVar46;
      local_80 = auVar50;
      do {
        local_2f0.hit = local_250;
        local_2f0.valid = (int *)local_300;
        uVar25 = (ulong)uVar24;
        uVar24 = *(uint *)(local_180 + uVar25 * 4);
        pGVar11 = (pSVar10->geometries).items[uVar24].ptr;
        if ((pGVar11->mask & *(uint *)(ray + k * 4 + 0x90)) == 0) {
          *(undefined4 *)(local_2a0 + uVar25 * 4) = 0;
        }
        else {
          if ((context->args->filter == (RTCFilterFunctionN)0x0) &&
             (pGVar11->intersectionFilterN == (RTCFilterFunctionN)0x0)) {
            uVar7 = *(undefined4 *)(local_160 + uVar25 * 4);
            uVar8 = *(undefined4 *)(local_140 + uVar25 * 4);
            *(undefined4 *)(ray + k * 4 + 0x80) = *(undefined4 *)(local_120 + uVar25 * 4);
            *(undefined4 *)(ray + k * 4 + 0xc0) = *(undefined4 *)((long)&local_100 + uVar25 * 4);
            *(undefined4 *)(ray + k * 4 + 0xd0) = *(undefined4 *)(local_e0 + uVar25 * 4);
            *(undefined4 *)(ray + k * 4 + 0xe0) = *(undefined4 *)((long)&local_c0 + uVar25 * 4);
            *(undefined4 *)(ray + k * 4 + 0xf0) = uVar7;
            *(undefined4 *)(ray + k * 4 + 0x100) = uVar8;
            *(uint *)(ray + k * 4 + 0x110) = (Disc->primIDs).field_0.i[uVar25];
            *(uint *)(ray + k * 4 + 0x120) = uVar24;
            *(uint *)(ray + k * 4 + 0x130) = context->user->instID[0];
            *(uint *)(ray + k * 4 + 0x140) = context->user->instPrimID[0];
            return;
          }
          local_220 = *(undefined4 *)(local_160 + uVar25 * 4);
          local_210 = *(undefined4 *)(local_140 + uVar25 * 4);
          local_1f0 = vpshufd_avx(ZEXT416(uVar24),0);
          local_200 = (Disc->primIDs).field_0.i[uVar25];
          uVar7 = *(undefined4 *)((long)&local_100 + uVar25 * 4);
          uVar8 = *(undefined4 *)(local_e0 + uVar25 * 4);
          local_240._4_4_ = uVar8;
          local_240._0_4_ = uVar8;
          local_240._8_4_ = uVar8;
          local_240._12_4_ = uVar8;
          uVar8 = *(undefined4 *)((long)&local_c0 + uVar25 * 4);
          local_230._4_4_ = uVar8;
          local_230._0_4_ = uVar8;
          local_230._8_4_ = uVar8;
          local_230._12_4_ = uVar8;
          local_250[0] = (RTCHitN)(char)uVar7;
          local_250[1] = (RTCHitN)(char)((uint)uVar7 >> 8);
          local_250[2] = (RTCHitN)(char)((uint)uVar7 >> 0x10);
          local_250[3] = (RTCHitN)(char)((uint)uVar7 >> 0x18);
          local_250[4] = (RTCHitN)(char)uVar7;
          local_250[5] = (RTCHitN)(char)((uint)uVar7 >> 8);
          local_250[6] = (RTCHitN)(char)((uint)uVar7 >> 0x10);
          local_250[7] = (RTCHitN)(char)((uint)uVar7 >> 0x18);
          local_250[8] = (RTCHitN)(char)uVar7;
          local_250[9] = (RTCHitN)(char)((uint)uVar7 >> 8);
          local_250[10] = (RTCHitN)(char)((uint)uVar7 >> 0x10);
          local_250[0xb] = (RTCHitN)(char)((uint)uVar7 >> 0x18);
          local_250[0xc] = (RTCHitN)(char)uVar7;
          local_250[0xd] = (RTCHitN)(char)((uint)uVar7 >> 8);
          local_250[0xe] = (RTCHitN)(char)((uint)uVar7 >> 0x10);
          local_250[0xf] = (RTCHitN)(char)((uint)uVar7 >> 0x18);
          uStack_21c = local_220;
          uStack_218 = local_220;
          uStack_214 = local_220;
          uStack_20c = local_210;
          uStack_208 = local_210;
          uStack_204 = local_210;
          uStack_1fc = local_200;
          uStack_1f8 = local_200;
          uStack_1f4 = local_200;
          uStack_1dc = context->user->instID[0];
          local_1e0 = uStack_1dc;
          uStack_1d8 = uStack_1dc;
          uStack_1d4 = uStack_1dc;
          uStack_1d0 = context->user->instPrimID[0];
          uStack_1cc = uStack_1d0;
          uStack_1c8 = uStack_1d0;
          uStack_1c4 = uStack_1d0;
          *(undefined4 *)(ray + k * 4 + 0x80) = *(undefined4 *)(local_120 + uVar25 * 4);
          local_300 = *pauVar27;
          local_2f0.geometryUserPtr = pGVar11->userPtr;
          local_2f0.context = context->user;
          local_2f0.N = 4;
          local_1c0 = auVar45._0_32_;
          local_2c0._0_16_ = auVar61._0_16_;
          local_2f0.ray = (RTCRayN *)ray;
          if (pGVar11->intersectionFilterN != (RTCFilterFunctionN)0x0) {
            local_280._0_8_ = pauVar27;
            auVar40 = ZEXT1632(auVar52._0_16_);
            auVar56 = auVar58._0_16_;
            (*pGVar11->intersectionFilterN)(&local_2f0);
            auVar61 = ZEXT1664(local_2c0._0_16_);
            auVar56 = vpcmpeqd_avx(auVar56,auVar56);
            auVar58 = ZEXT1664(auVar56);
            auVar54 = ZEXT1664(ZEXT816(0) << 0x40);
            auVar40 = vcmpps_avx(auVar40,auVar40,0xf);
            auVar52 = ZEXT3264(auVar40);
            auVar49 = ZEXT3264(CONCAT428(0x7f800000,
                                         CONCAT424(0x7f800000,
                                                   CONCAT420(0x7f800000,
                                                             CONCAT416(0x7f800000,
                                                                       CONCAT412(0x7f800000,
                                                                                 CONCAT48(0x7f800000
                                                                                          ,
                                                  0x7f8000007f800000)))))));
            auVar45 = ZEXT3264(local_1c0);
            pauVar27 = (undefined1 (*) [16])local_280._0_8_;
          }
          auVar56 = auVar58._0_16_;
          if (local_300 == (undefined1  [16])0x0) {
            auVar55 = vpcmpeqd_avx(auVar54._0_16_,(undefined1  [16])0x0);
            auVar56 = auVar56 ^ auVar55;
          }
          else {
            p_Var14 = context->args->filter;
            if ((p_Var14 != (RTCFilterFunctionN)0x0) &&
               (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                 RTC_RAY_QUERY_FLAG_INCOHERENT || (((pGVar11->field_8).field_0x2 & 0x40) != 0)))) {
              auVar40 = ZEXT1632(auVar52._0_16_);
              (*p_Var14)(&local_2f0);
              auVar61 = ZEXT1664(local_2c0._0_16_);
              auVar56 = vpcmpeqd_avx(auVar56,auVar56);
              auVar58 = ZEXT1664(auVar56);
              auVar54 = ZEXT1664(ZEXT816(0) << 0x40);
              auVar40 = vcmpps_avx(auVar40,auVar40,0xf);
              auVar52 = ZEXT3264(auVar40);
              auVar49 = ZEXT3264(CONCAT428(0x7f800000,
                                           CONCAT424(0x7f800000,
                                                     CONCAT420(0x7f800000,
                                                               CONCAT416(0x7f800000,
                                                                         CONCAT412(0x7f800000,
                                                                                   CONCAT48(
                                                  0x7f800000,0x7f8000007f800000)))))));
              auVar45 = ZEXT3264(local_1c0);
            }
            auVar55 = vpcmpeqd_avx(auVar54._0_16_,local_300);
            auVar56 = auVar58._0_16_ ^ auVar55;
            if (local_300 != (undefined1  [16])0x0) {
              auVar55 = auVar58._0_16_ ^ auVar55;
              auVar9 = vmaskmovps_avx(auVar55,*(undefined1 (*) [16])local_2f0.hit);
              *(undefined1 (*) [16])(local_2f0.ray + 0xc0) = auVar9;
              auVar9 = vmaskmovps_avx(auVar55,*(undefined1 (*) [16])(local_2f0.hit + 0x10));
              *(undefined1 (*) [16])(local_2f0.ray + 0xd0) = auVar9;
              auVar9 = vmaskmovps_avx(auVar55,*(undefined1 (*) [16])(local_2f0.hit + 0x20));
              *(undefined1 (*) [16])(local_2f0.ray + 0xe0) = auVar9;
              auVar9 = vmaskmovps_avx(auVar55,*(undefined1 (*) [16])(local_2f0.hit + 0x30));
              *(undefined1 (*) [16])(local_2f0.ray + 0xf0) = auVar9;
              auVar9 = vmaskmovps_avx(auVar55,*(undefined1 (*) [16])(local_2f0.hit + 0x40));
              *(undefined1 (*) [16])(local_2f0.ray + 0x100) = auVar9;
              auVar9 = vmaskmovps_avx(auVar55,*(undefined1 (*) [16])(local_2f0.hit + 0x50));
              *(undefined1 (*) [16])(local_2f0.ray + 0x110) = auVar9;
              auVar9 = vmaskmovps_avx(auVar55,*(undefined1 (*) [16])(local_2f0.hit + 0x60));
              *(undefined1 (*) [16])(local_2f0.ray + 0x120) = auVar9;
              auVar9 = vmaskmovps_avx(auVar55,*(undefined1 (*) [16])(local_2f0.hit + 0x70));
              *(undefined1 (*) [16])(local_2f0.ray + 0x130) = auVar9;
              auVar55 = vmaskmovps_avx(auVar55,*(undefined1 (*) [16])(local_2f0.hit + 0x80));
              *(undefined1 (*) [16])(local_2f0.ray + 0x140) = auVar55;
            }
          }
          if ((auVar61._0_16_ & auVar56) == (undefined1  [16])0x0) {
            *(int *)(ray + k * 4 + 0x80) = local_1a0._0_4_;
            auVar40 = local_1a0;
          }
          else {
            auVar40 = ZEXT432(*(uint *)(ray + k * 4 + 0x80));
          }
          *(undefined4 *)(local_2a0 + uVar25 * 4) = 0;
          local_1a0 = auVar40;
          auVar56 = vshufps_avx(auVar40._0_16_,auVar40._0_16_,0);
          auVar35._16_16_ = auVar56;
          auVar35._0_16_ = auVar56;
          auVar40 = vcmpps_avx(auVar45._0_32_,auVar35,2);
          local_2a0 = vandps_avx(auVar40,local_2a0);
        }
        if ((((((((local_2a0 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                 (local_2a0 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                (local_2a0 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
               SUB321(local_2a0 >> 0x7f,0) == '\0') &&
              (local_2a0 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
             SUB321(local_2a0 >> 0xbf,0) == '\0') &&
            (local_2a0 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
            -1 < local_2a0[0x1f]) {
          return;
        }
        auVar40 = vblendvps_avx(auVar49._0_32_,auVar45._0_32_,local_2a0);
        auVar34 = vshufps_avx(auVar40,auVar40,0xb1);
        auVar34 = vminps_avx(auVar40,auVar34);
        auVar36 = vshufpd_avx(auVar34,auVar34,5);
        auVar34 = vminps_avx(auVar34,auVar36);
        auVar36 = vperm2f128_avx(auVar34,auVar34,1);
        auVar34 = vminps_avx(auVar34,auVar36);
        auVar34 = vcmpps_avx(auVar40,auVar34,0);
        auVar36 = local_2a0 & auVar34;
        auVar40 = local_2a0;
        if ((((((((auVar36 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                 (auVar36 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                (auVar36 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
               SUB321(auVar36 >> 0x7f,0) != '\0') ||
              (auVar36 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
             SUB321(auVar36 >> 0xbf,0) != '\0') ||
            (auVar36 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
            auVar36[0x1f] < '\0') {
          auVar40 = vandps_avx(auVar34,local_2a0);
        }
        uVar23 = vmovmskps_avx(auVar40);
        uVar24 = 0;
        if (uVar23 != 0) {
          for (; (uVar23 >> uVar24 & 1) == 0; uVar24 = uVar24 + 1) {
          }
        }
      } while( true );
    }
  }
  return;
}

Assistant:

static __forceinline void intersect(
          const Precalculations& pre, RayHitK<K>& ray, size_t k, RayQueryContext* context, const Primitive& Disc)
      {
        STAT3(normal.trav_prims, 1, 1, 1);
        const Points* geom = context->scene->get<Points>(Disc.geomID());
        Vec4vf<M> v0; Vec3vf<M> n0;
        Disc.gather(v0, n0, geom);
        const vbool<M> valid = Disc.valid();
        DiscIntersectorK<M, K>::intersect(
            valid, ray, k, context, geom, pre, v0, n0,
            Intersect1KEpilogM<M, K, filter>(ray, k, context, Disc.geomID(), Disc.primID()));
      }